

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QWizardField>::moveAppend
          (QGenericArrayOps<QWizardField> *this,QWizardField *b,QWizardField *e)

{
  qsizetype *pqVar1;
  undefined8 *puVar2;
  QWizardField *pQVar3;
  long lVar4;
  Data *pDVar5;
  char16_t *pcVar6;
  qsizetype qVar7;
  Data *pDVar8;
  char *pcVar9;
  QObject *pQVar10;
  PrivateShared *pPVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  QWizardField *pQVar14;
  undefined7 uVar15;
  
  if ((b != e) && (b < e)) {
    pQVar3 = (this->super_QArrayDataPointer<QWizardField>).ptr;
    do {
      lVar4 = (this->super_QArrayDataPointer<QWizardField>).size;
      pQVar3[lVar4].page = b->page;
      pDVar5 = (b->name).d.d;
      (b->name).d.d = (Data *)0x0;
      pQVar3[lVar4].name.d.d = pDVar5;
      pcVar6 = (b->name).d.ptr;
      (b->name).d.ptr = (char16_t *)0x0;
      pQVar3[lVar4].name.d.ptr = pcVar6;
      qVar7 = (b->name).d.size;
      (b->name).d.size = 0;
      pQVar3[lVar4].name.d.size = qVar7;
      uVar15 = *(undefined7 *)&b->field_0x21;
      pQVar10 = b->object;
      pQVar14 = pQVar3 + lVar4;
      pQVar14->mandatory = b->mandatory;
      *(undefined7 *)&pQVar14->field_0x21 = uVar15;
      *(QObject **)(&pQVar14->mandatory + 8) = pQVar10;
      pDVar8 = (b->property).d.d;
      (b->property).d.d = (Data *)0x0;
      pQVar3[lVar4].property.d.d = pDVar8;
      pcVar9 = (b->property).d.ptr;
      (b->property).d.ptr = (char *)0x0;
      pQVar3[lVar4].property.d.ptr = pcVar9;
      qVar7 = (b->property).d.size;
      (b->property).d.size = 0;
      pQVar3[lVar4].property.d.size = qVar7;
      pDVar8 = (b->changedSignal).d.d;
      (b->changedSignal).d.d = (Data *)0x0;
      pQVar3[lVar4].changedSignal.d.d = pDVar8;
      pcVar9 = (b->changedSignal).d.ptr;
      (b->changedSignal).d.ptr = (char *)0x0;
      pQVar3[lVar4].changedSignal.d.ptr = pcVar9;
      qVar7 = (b->changedSignal).d.size;
      (b->changedSignal).d.size = 0;
      pQVar3[lVar4].changedSignal.d.size = qVar7;
      pPVar11 = (b->initialValue).d.data.shared;
      uVar12 = *(undefined8 *)((long)&(b->initialValue).d.data + 8);
      uVar13 = *(undefined8 *)&(b->initialValue).d.field_0x18;
      puVar2 = (undefined8 *)((long)&pQVar3[lVar4].initialValue.d.data + 0x10);
      *puVar2 = *(undefined8 *)((long)&(b->initialValue).d.data + 0x10);
      puVar2[1] = uVar13;
      pQVar3[lVar4].initialValue.d.data.shared = pPVar11;
      *(undefined8 *)((long)&pQVar3[lVar4].initialValue.d.data + 8) = uVar12;
      (b->initialValue).d.data.shared = (PrivateShared *)0x0;
      *(undefined8 *)((long)&(b->initialValue).d.data + 8) = 0;
      *(undefined8 *)((long)&(b->initialValue).d.data + 0x10) = 0;
      *(undefined8 *)&(b->initialValue).d.field_0x18 = 2;
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<QWizardField>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }